

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O0

PixelColor color_from_gradient_range(GradientColor *left,GradientColor *right,float pos)

{
  float fVar1;
  float fVar2;
  float fVar3;
  PixelColor local_2c;
  float relative_pos_between_colors;
  float pos_local;
  GradientColor *right_local;
  GradientColor *left_local;
  
  fVar1 = (pos - left->pos) / (right->pos - left->pos);
  fVar2 = std::lerp(left->r,right->r,fVar1);
  fVar3 = std::lerp(left->g,right->g,fVar1);
  fVar1 = std::lerp(left->b,right->b,fVar1);
  local_2c.b = (uchar)(int)(fVar1 * 255.0);
  local_2c.r = (char)(int)(fVar2 * 255.0);
  local_2c.g = (char)(int)(fVar3 * 255.0);
  return local_2c;
}

Assistant:

PixelColor color_from_gradient_range(const GradientColor& left, const GradientColor& right, const float pos) noexcept
{
    const float relative_pos_between_colors = (pos - left.pos) / (right.pos - left.pos);
    return PixelColor{static_cast<unsigned char>(255.0f * std::lerp(left.r, right.r, relative_pos_between_colors)),
                      static_cast<unsigned char>(255.0f * std::lerp(left.g, right.g, relative_pos_between_colors)),
                      static_cast<unsigned char>(255.0f * std::lerp(left.b, right.b, relative_pos_between_colors))};
}